

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void dr_prediction_z1_64xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  ushort uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar16 [32];
  
  if (0 < N) {
    uVar1 = above[(long)N + 0x3f];
    auVar15[1] = uVar1;
    auVar15[0] = uVar1;
    auVar15[2] = uVar1;
    auVar15[3] = uVar1;
    auVar15[4] = uVar1;
    auVar15[5] = uVar1;
    auVar15[6] = uVar1;
    auVar15[7] = uVar1;
    auVar15[8] = uVar1;
    auVar15[9] = uVar1;
    auVar15[10] = uVar1;
    auVar15[0xb] = uVar1;
    auVar15[0xc] = uVar1;
    auVar15[0xd] = uVar1;
    auVar15[0xe] = uVar1;
    auVar15[0xf] = uVar1;
    auVar16[0x10] = uVar1;
    auVar16._0_16_ = auVar15;
    auVar16[0x11] = uVar1;
    auVar16[0x12] = uVar1;
    auVar16[0x13] = uVar1;
    auVar16[0x14] = uVar1;
    auVar16[0x15] = uVar1;
    auVar16[0x16] = uVar1;
    auVar16[0x17] = uVar1;
    auVar16[0x18] = uVar1;
    auVar16[0x19] = uVar1;
    auVar16[0x1a] = uVar1;
    auVar16[0x1b] = uVar1;
    auVar16[0x1c] = uVar1;
    auVar16[0x1d] = uVar1;
    auVar16[0x1e] = uVar1;
    auVar16[0x1f] = uVar1;
    lVar7 = (long)N + 0x3f;
    auVar17[0] = (undefined1)lVar7;
    auVar17[1] = auVar17[0];
    auVar17[2] = auVar17[0];
    auVar17[3] = auVar17[0];
    auVar17[4] = auVar17[0];
    auVar17[5] = auVar17[0];
    auVar17[6] = auVar17[0];
    auVar17[7] = auVar17[0];
    auVar17[8] = auVar17[0];
    auVar17[9] = auVar17[0];
    auVar17[10] = auVar17[0];
    auVar17[0xb] = auVar17[0];
    auVar17[0xc] = auVar17[0];
    auVar17[0xd] = auVar17[0];
    auVar17[0xe] = auVar17[0];
    auVar17[0xf] = auVar17[0];
    iVar11 = 0;
    auVar18._8_2_ = 0x10;
    auVar18._0_8_ = 0x10001000100010;
    auVar18._10_2_ = 0x10;
    auVar18._12_2_ = 0x10;
    auVar18._14_2_ = 0x10;
    auVar18._16_2_ = 0x10;
    auVar18._18_2_ = 0x10;
    auVar18._20_2_ = 0x10;
    auVar18._22_2_ = 0x10;
    auVar18._24_2_ = 0x10;
    auVar18._26_2_ = 0x10;
    auVar18._28_2_ = 0x10;
    auVar18._30_2_ = 0x10;
    iVar12 = N;
    uVar8 = upsample_above;
    do {
      iVar9 = (int)uVar8 >> 6;
      iVar10 = iVar12;
      if (iVar9 < (int)lVar7) {
        uVar6 = (ushort)(uVar8 >> 1);
        uVar19 = uVar6 & 0x1f;
        auVar20._0_8_ = CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
        auVar20._8_2_ = uVar19;
        auVar20._10_2_ = uVar19;
        auVar20._12_2_ = uVar19;
        auVar20._14_2_ = uVar19;
        auVar20._16_2_ = uVar19;
        auVar20._18_2_ = uVar19;
        auVar20._20_2_ = uVar19;
        auVar20._22_2_ = uVar19;
        auVar20._24_2_ = uVar19;
        auVar20._26_2_ = uVar19;
        auVar20._28_2_ = uVar19;
        auVar20._30_2_ = uVar19;
        lVar14 = (long)iVar9;
        uVar13 = 0xfffffffffffffff0;
        do {
          auVar2 = auVar15;
          if ((long)(lVar14 + uVar13 + 0x10) < lVar7) {
            auVar21 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar13 + lVar14 + 0x10));
            auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar13 + lVar14 + 0x11));
            auVar5 = vpsubw_avx2(auVar5,auVar21);
            auVar5 = vpmullw_avx2(auVar5,auVar20);
            auVar21 = vpsllw_avx2(auVar21,5);
            auVar21 = vpaddw_avx2(auVar21,auVar18);
            auVar21 = vpaddw_avx2(auVar5,auVar21);
            auVar21 = vpsrlw_avx2(auVar21,5);
            auVar2 = vpackuswb_avx(auVar21._0_16_,auVar21._16_16_);
            iVar10 = iVar9 + (int)uVar13;
            uVar22 = (undefined1)(iVar10 + 0x10U);
            auVar23[1] = uVar22;
            auVar23[0] = uVar22;
            auVar23[2] = uVar22;
            auVar23[3] = uVar22;
            auVar23[4] = uVar22;
            auVar23[5] = uVar22;
            auVar23[6] = uVar22;
            auVar23[7] = uVar22;
            auVar23[8] = uVar22;
            auVar23[9] = uVar22;
            auVar23[10] = uVar22;
            auVar23[0xb] = uVar22;
            auVar23[0xc] = uVar22;
            auVar23[0xd] = uVar22;
            auVar23[0xe] = uVar22;
            auVar23[0xf] = uVar22;
            auVar3 = vpaddb_avx(auVar23,SUB6416(ZEXT464(0x7060504),0));
            auVar23 = vpaddb_avx(auVar23,ZEXT816(0xf0e0d0c0b0a0908));
            auVar4 = vpinsrb_avx(ZEXT416(iVar10 + 0x10U),iVar10 + 0x11,1);
            auVar4 = vpinsrb_avx(auVar4,iVar10 + 0x12,2);
            auVar4 = vpinsrb_avx(auVar4,CONCAT31((int3)((uint)iVar10 >> 8),(char)iVar10 + '\x13'),3)
            ;
            auVar3 = vpunpckldq_avx(auVar4,auVar3);
            auVar3 = vpunpcklqdq_avx(auVar3,auVar23);
            auVar3 = vpsubusb_avx(auVar17,auVar3);
            auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
            auVar2 = vpblendvb_avx(auVar15,auVar2,auVar3);
          }
          *(undefined1 (*) [16])(*(undefined1 (*) [32])dst + uVar13 + 0x10) = auVar2;
          uVar13 = uVar13 + 0x10;
        } while (uVar13 < 0x30);
        uVar8 = uVar8 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])dst = auVar16;
          *(undefined1 (*) [32])((long)dst + 0x20) = auVar16;
          dst = *(undefined1 (*) [32])dst + stride;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      if ((int)lVar7 <= iVar9) {
        return;
      }
      iVar11 = iVar11 + 1;
      dst = *(undefined1 (*) [32])dst + stride;
      iVar12 = iVar12 + -1;
    } while (iVar11 < N);
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16;
  __m256i a_mbase_x, diff, c3f;
  __m128i max_base_x128, base_inc128, mask128;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi8((int8_t)above[max_base_x]);
  max_base_x128 = _mm_set1_epi8(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    __m128i a0_128, a1_128, res128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j),
                         _mm256_castsi256_si128(a_mbase_x));
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu8_epi16(a0_128);
        a1 = _mm256_cvtepu8_epi16(a1_128);

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);
        res = _mm256_packus_epi16(
            res, _mm256_castsi128_si256(
                     _mm256_extracti128_si256(res, 1)));  // 16 8bit values

        base_inc128 =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask128 = _mm_cmpgt_epi8(_mm_subs_epu8(max_base_x128, base_inc128),
                                 _mm_setzero_si128());
        res128 = _mm_blendv_epi8(_mm256_castsi256_si128(a_mbase_x),
                                 _mm256_castsi256_si128(res), mask128);
        _mm_storeu_si128((__m128i *)(dst + j), res128);
      }
    }
    x += dx;
  }
}